

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O0

void vkt::anon_unknown_0::logRenderPassInfo(TestLog *log,RenderPass *renderPass)

{
  ScopedLogSection SVar1;
  bool bVar2;
  deUint32 dVar3;
  VkDependencyFlags value;
  vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
  *this;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  vector<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
  *this_00;
  const_reference this_01;
  vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
  *this_02;
  vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
  *this_03;
  vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
  *this_04;
  AttachmentReference *this_05;
  const_reference pvVar6;
  vector<vkt::(anonymous_namespace)::SubpassDependency,_std::allocator<vkt::(anonymous_namespace)::SubpassDependency>_>
  *pvVar7;
  Bitfield<32UL> local_2c68;
  MessageBuilder local_2c50;
  VkAccessFlags local_2acc;
  MessageBuilder local_2ac8;
  VkAccessFlags local_2944;
  MessageBuilder local_2940;
  VkPipelineStageFlags local_27bc;
  MessageBuilder local_27b8;
  VkPipelineStageFlags local_2634;
  MessageBuilder local_2630;
  deUint32 local_24ac;
  MessageBuilder local_24a8;
  deUint32 local_2324;
  MessageBuilder local_2320;
  const_reference local_21a0;
  SubpassDependency *dep;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2178;
  string local_2158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2138;
  ScopedLogSection local_2118;
  ScopedLogSection dependencySection;
  size_t depNdx;
  string local_2100;
  allocator<char> local_20d9;
  string local_20d8;
  ScopedLogSection local_20b8;
  ScopedLogSection dependenciesSection;
  value_type local_1f2c;
  undefined1 local_1f28 [4];
  deUint32 preserveAttachment;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f08;
  string local_1ee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ec8;
  ScopedLogSection local_1ea8;
  ScopedLogSection preserveAttachmentSection;
  size_t preserveNdx;
  string local_1e90;
  allocator<char> local_1e69;
  string local_1e68;
  ScopedLogSection local_1e48;
  ScopedLogSection preserveAttachmentsSection;
  MessageBuilder local_1e38;
  deUint32 local_1cb4;
  MessageBuilder local_1cb0;
  const_reference local_1b30;
  AttachmentReference *resolveAttachment;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b08;
  string local_1ae8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ac8;
  ScopedLogSection local_1aa8;
  ScopedLogSection resolveAttachmentSection;
  size_t resolveNdx;
  string local_1a90;
  allocator<char> local_1a69;
  string local_1a68;
  ScopedLogSection local_1a48;
  ScopedLogSection resolveAttachmentsSection;
  MessageBuilder local_1a38;
  deUint32 local_18b4;
  MessageBuilder local_18b0;
  const_reference local_1730;
  AttachmentReference *colorAttachment;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1708;
  string local_16e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16c8;
  ScopedLogSection local_16a8;
  ScopedLogSection colorAttachmentSection;
  size_t colorNdx;
  string local_1690;
  allocator<char> local_1669;
  string local_1668;
  ScopedLogSection local_1648;
  ScopedLogSection colorAttachmentsSection;
  MessageBuilder local_1638;
  deUint32 local_14b4;
  MessageBuilder local_14b0;
  AttachmentReference *local_1330;
  AttachmentReference *depthStencilAttachment;
  string local_1320;
  allocator<char> local_12f9;
  string local_12f8;
  ScopedLogSection local_12d8;
  ScopedLogSection depthStencilAttachmentSection;
  MessageBuilder local_12c8;
  deUint32 local_1144;
  MessageBuilder local_1140;
  const_reference local_fc0;
  AttachmentReference *inputAttachment;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f98;
  string local_f78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f58;
  ScopedLogSection local_f38;
  ScopedLogSection inputAttachmentSection;
  size_t inputNdx;
  string local_f20;
  allocator<char> local_ef9;
  string local_ef8;
  ScopedLogSection local_ed8;
  ScopedLogSection inputAttachmentsSection;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *preserveAttachments;
  vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
  *resolveAttachments;
  vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
  *colorAttachments;
  vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
  *inputAttachments;
  Subpass *subpass;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e88;
  string local_e68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e48;
  ScopedLogSection local_e28;
  ScopedLogSection subpassSection;
  size_t subpassNdx;
  vector<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
  *subpasses;
  string local_e08;
  allocator<char> local_de1;
  string local_de0;
  ScopedLogSection local_dc0;
  ScopedLogSection subpassesSection;
  MessageBuilder local_db0;
  VkImageLayout local_c2c;
  MessageBuilder local_c28;
  VkAttachmentStoreOp local_aa4;
  MessageBuilder local_aa0;
  VkAttachmentLoadOp local_91c;
  MessageBuilder local_918;
  VkAttachmentStoreOp local_794;
  MessageBuilder local_790;
  VkAttachmentLoadOp local_60c;
  MessageBuilder local_608;
  VkSampleCountFlagBits local_484;
  MessageBuilder local_480;
  VkFormat local_2fc;
  MessageBuilder local_2f8;
  const_reference local_178;
  Attachment *attachment;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  ScopedLogSection local_f0;
  ScopedLogSection attachmentSection;
  size_t attachmentNdx;
  vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
  *attachments;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  ScopedLogSection local_88;
  ScopedLogSection attachmentsSection;
  string local_78;
  allocator<char> local_41;
  string local_40;
  ScopedLogSection local_20;
  ScopedLogSection section;
  RenderPass *renderPass_local;
  TestLog *log_local;
  
  section.m_log = (TestLog *)renderPass;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"RenderPass",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"RenderPass",
             (allocator<char> *)((long)&attachmentsSection.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_20,log,&local_40,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&attachmentsSection.m_log + 7));
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"Attachments",&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"Attachments",(allocator<char> *)((long)&attachments + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_88,log,&local_a8,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&attachments + 7));
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  this = RenderPass::getAttachments((RenderPass *)section.m_log);
  attachmentSection.m_log = (TestLog *)0x0;
  while( true ) {
    SVar1.m_log = attachmentSection.m_log;
    pTVar4 = (TestLog *)
             std::
             vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
             ::size(this);
    if (pTVar4 <= SVar1.m_log) break;
    de::toString<unsigned_long>(&local_130,(unsigned_long *)&attachmentSection);
    std::operator+(&local_110,"Attachment",&local_130);
    de::toString<unsigned_long>((string *)&attachment,(unsigned_long *)&attachmentSection);
    std::operator+(&local_150,"Attachment ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&attachment)
    ;
    tcu::ScopedLogSection::ScopedLogSection(&local_f0,log,&local_110,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&attachment);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    local_178 = std::
                vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                ::operator[](this,(size_type)attachmentSection.m_log);
    tcu::TestLog::operator<<(&local_2f8,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_2f8,(char (*) [9])"Format: ");
    local_2fc = Attachment::getFormat(local_178);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_2fc);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2f8);
    tcu::TestLog::operator<<(&local_480,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_480,(char (*) [10])"Samples: ");
    local_484 = Attachment::getSamples(local_178);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_484);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_480);
    tcu::TestLog::operator<<(&local_608,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_608,(char (*) [9])0x12f72d4);
    local_60c = Attachment::getLoadOp(local_178);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_60c);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_608);
    tcu::TestLog::operator<<(&local_790,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_790,(char (*) [10])0x12f72e4);
    local_794 = Attachment::getStoreOp(local_178);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_794);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_790);
    tcu::TestLog::operator<<(&local_918,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_918,(char (*) [16])"StencilLoadOp: ");
    local_91c = Attachment::getStencilLoadOp(local_178);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_91c);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_918);
    tcu::TestLog::operator<<(&local_aa0,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_aa0,(char (*) [17])"StencilStoreOp: ");
    local_aa4 = Attachment::getStencilStoreOp(local_178);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_aa4);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_aa0);
    tcu::TestLog::operator<<(&local_c28,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_c28,(char (*) [16])"InitialLayout: ");
    local_c2c = Attachment::getInitialLayout(local_178);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_c2c);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_c28);
    tcu::TestLog::operator<<(&local_db0,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_db0,(char (*) [14])"FinalLayout: ");
    subpassesSection.m_log._4_4_ = Attachment::getFinalLayout(local_178);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(VkImageLayout *)((long)&subpassesSection.m_log + 4));
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_db0);
    tcu::ScopedLogSection::~ScopedLogSection(&local_f0);
    attachmentSection.m_log = (TestLog *)((long)&(attachmentSection.m_log)->m_log + 1);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_de0,"Subpasses",&local_de1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e08,"Subpasses",(allocator<char> *)((long)&subpasses + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_dc0,log,&local_de0,&local_e08);
  std::__cxx11::string::~string((string *)&local_e08);
  std::allocator<char>::~allocator((allocator<char> *)((long)&subpasses + 7));
  std::__cxx11::string::~string((string *)&local_de0);
  std::allocator<char>::~allocator(&local_de1);
  this_00 = RenderPass::getSubpasses((RenderPass *)section.m_log);
  subpassSection.m_log = (TestLog *)0x0;
  while( true ) {
    SVar1.m_log = subpassSection.m_log;
    pTVar4 = (TestLog *)
             std::
             vector<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
             ::size(this_00);
    if (pTVar4 <= SVar1.m_log) break;
    de::toString<unsigned_long>(&local_e68,(unsigned_long *)&subpassSection);
    std::operator+(&local_e48,"Subpass",&local_e68);
    de::toString<unsigned_long>((string *)&subpass,(unsigned_long *)&subpassSection);
    std::operator+(&local_e88,"Subpass ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&subpass);
    tcu::ScopedLogSection::ScopedLogSection(&local_e28,log,&local_e48,&local_e88);
    std::__cxx11::string::~string((string *)&local_e88);
    std::__cxx11::string::~string((string *)&subpass);
    std::__cxx11::string::~string((string *)&local_e48);
    std::__cxx11::string::~string((string *)&local_e68);
    this_01 = std::
              vector<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
              ::operator[](this_00,(size_type)subpassSection.m_log);
    this_02 = Subpass::getInputAttachments(this_01);
    this_03 = Subpass::getColorAttachments(this_01);
    this_04 = Subpass::getResolveAttachments(this_01);
    inputAttachmentsSection.m_log = (TestLog *)Subpass::getPreserveAttachments(this_01);
    bVar2 = std::
            vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
            ::empty(this_02);
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_ef8,"Inputs",&local_ef9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f20,"Inputs",(allocator<char> *)((long)&inputNdx + 7));
      tcu::ScopedLogSection::ScopedLogSection(&local_ed8,log,&local_ef8,&local_f20);
      std::__cxx11::string::~string((string *)&local_f20);
      std::allocator<char>::~allocator((allocator<char> *)((long)&inputNdx + 7));
      std::__cxx11::string::~string((string *)&local_ef8);
      std::allocator<char>::~allocator(&local_ef9);
      inputAttachmentSection.m_log = (TestLog *)0x0;
      while( true ) {
        SVar1.m_log = inputAttachmentSection.m_log;
        pTVar4 = (TestLog *)
                 std::
                 vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                 ::size(this_02);
        if (pTVar4 <= SVar1.m_log) break;
        de::toString<unsigned_long>(&local_f78,(unsigned_long *)&inputAttachmentSection);
        std::operator+(&local_f58,"Input",&local_f78);
        de::toString<unsigned_long>
                  ((string *)&inputAttachment,(unsigned_long *)&inputAttachmentSection);
        std::operator+(&local_f98,"Input ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &inputAttachment);
        tcu::ScopedLogSection::ScopedLogSection(&local_f38,log,&local_f58,&local_f98);
        std::__cxx11::string::~string((string *)&local_f98);
        std::__cxx11::string::~string((string *)&inputAttachment);
        std::__cxx11::string::~string((string *)&local_f58);
        std::__cxx11::string::~string((string *)&local_f78);
        local_fc0 = std::
                    vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                    ::operator[](this_02,(size_type)inputAttachmentSection.m_log);
        tcu::TestLog::operator<<(&local_1140,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<(&local_1140,(char (*) [13])"Attachment: ");
        local_1144 = AttachmentReference::getAttachment(local_fc0);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1144);
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1140);
        tcu::TestLog::operator<<(&local_12c8,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<(&local_12c8,(char (*) [9])0x135d65c);
        depthStencilAttachmentSection.m_log._4_4_ = AttachmentReference::getImageLayout(local_fc0);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(VkImageLayout *)((long)&depthStencilAttachmentSection.m_log + 4)
                           );
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_12c8);
        tcu::ScopedLogSection::~ScopedLogSection(&local_f38);
        inputAttachmentSection.m_log = (TestLog *)((long)&(inputAttachmentSection.m_log)->m_log + 1)
        ;
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_ed8);
    }
    this_05 = Subpass::getDepthStencilAttachment(this_01);
    dVar3 = AttachmentReference::getAttachment(this_05);
    if (dVar3 != 0xffffffff) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_12f8,"DepthStencil",&local_12f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1320,"DepthStencil",
                 (allocator<char> *)((long)&depthStencilAttachment + 7));
      tcu::ScopedLogSection::ScopedLogSection(&local_12d8,log,&local_12f8,&local_1320);
      std::__cxx11::string::~string((string *)&local_1320);
      std::allocator<char>::~allocator((allocator<char> *)((long)&depthStencilAttachment + 7));
      std::__cxx11::string::~string((string *)&local_12f8);
      std::allocator<char>::~allocator(&local_12f9);
      local_1330 = Subpass::getDepthStencilAttachment(this_01);
      tcu::TestLog::operator<<(&local_14b0,log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_14b0,(char (*) [13])"Attachment: ");
      local_14b4 = AttachmentReference::getAttachment(local_1330);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_14b4);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_14b0);
      tcu::TestLog::operator<<(&local_1638,log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_1638,(char (*) [9])0x135d65c);
      colorAttachmentsSection.m_log._4_4_ = AttachmentReference::getImageLayout(local_1330);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (pMVar5,(VkImageLayout *)((long)&colorAttachmentsSection.m_log + 4));
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1638);
      tcu::ScopedLogSection::~ScopedLogSection(&local_12d8);
    }
    bVar2 = std::
            vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
            ::empty(this_03);
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1668,"Colors",&local_1669)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1690,"Colors",(allocator<char> *)((long)&colorNdx + 7));
      tcu::ScopedLogSection::ScopedLogSection(&local_1648,log,&local_1668,&local_1690);
      std::__cxx11::string::~string((string *)&local_1690);
      std::allocator<char>::~allocator((allocator<char> *)((long)&colorNdx + 7));
      std::__cxx11::string::~string((string *)&local_1668);
      std::allocator<char>::~allocator(&local_1669);
      colorAttachmentSection.m_log = (TestLog *)0x0;
      while( true ) {
        SVar1.m_log = colorAttachmentSection.m_log;
        pTVar4 = (TestLog *)
                 std::
                 vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                 ::size(this_03);
        if (pTVar4 <= SVar1.m_log) break;
        de::toString<unsigned_long>(&local_16e8,(unsigned_long *)&colorAttachmentSection);
        std::operator+(&local_16c8,"Color",&local_16e8);
        de::toString<unsigned_long>
                  ((string *)&colorAttachment,(unsigned_long *)&colorAttachmentSection);
        std::operator+(&local_1708,"Color ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &colorAttachment);
        tcu::ScopedLogSection::ScopedLogSection(&local_16a8,log,&local_16c8,&local_1708);
        std::__cxx11::string::~string((string *)&local_1708);
        std::__cxx11::string::~string((string *)&colorAttachment);
        std::__cxx11::string::~string((string *)&local_16c8);
        std::__cxx11::string::~string((string *)&local_16e8);
        local_1730 = std::
                     vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                     ::operator[](this_03,(size_type)colorAttachmentSection.m_log);
        tcu::TestLog::operator<<(&local_18b0,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<(&local_18b0,(char (*) [13])"Attachment: ");
        local_18b4 = AttachmentReference::getAttachment(local_1730);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_18b4);
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_18b0);
        tcu::TestLog::operator<<(&local_1a38,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<(&local_1a38,(char (*) [9])0x135d65c);
        resolveAttachmentsSection.m_log._4_4_ = AttachmentReference::getImageLayout(local_1730);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(VkImageLayout *)((long)&resolveAttachmentsSection.m_log + 4));
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1a38);
        tcu::ScopedLogSection::~ScopedLogSection(&local_16a8);
        colorAttachmentSection.m_log = (TestLog *)((long)&(colorAttachmentSection.m_log)->m_log + 1)
        ;
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_1648);
    }
    bVar2 = std::
            vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
            ::empty(this_04);
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a68,"Resolves",&local_1a69);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a90,"Resolves",(allocator<char> *)((long)&resolveNdx + 7));
      tcu::ScopedLogSection::ScopedLogSection(&local_1a48,log,&local_1a68,&local_1a90);
      std::__cxx11::string::~string((string *)&local_1a90);
      std::allocator<char>::~allocator((allocator<char> *)((long)&resolveNdx + 7));
      std::__cxx11::string::~string((string *)&local_1a68);
      std::allocator<char>::~allocator(&local_1a69);
      resolveAttachmentSection.m_log = (TestLog *)0x0;
      while( true ) {
        SVar1.m_log = resolveAttachmentSection.m_log;
        pTVar4 = (TestLog *)
                 std::
                 vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                 ::size(this_04);
        if (pTVar4 <= SVar1.m_log) break;
        de::toString<unsigned_long>(&local_1ae8,(unsigned_long *)&resolveAttachmentSection);
        std::operator+(&local_1ac8,"Resolve",&local_1ae8);
        de::toString<unsigned_long>
                  ((string *)&resolveAttachment,(unsigned_long *)&resolveAttachmentSection);
        std::operator+(&local_1b08,"Resolve ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &resolveAttachment);
        tcu::ScopedLogSection::ScopedLogSection(&local_1aa8,log,&local_1ac8,&local_1b08);
        std::__cxx11::string::~string((string *)&local_1b08);
        std::__cxx11::string::~string((string *)&resolveAttachment);
        std::__cxx11::string::~string((string *)&local_1ac8);
        std::__cxx11::string::~string((string *)&local_1ae8);
        local_1b30 = std::
                     vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                     ::operator[](this_04,(size_type)resolveAttachmentSection.m_log);
        tcu::TestLog::operator<<(&local_1cb0,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<(&local_1cb0,(char (*) [13])"Attachment: ");
        local_1cb4 = AttachmentReference::getAttachment(local_1b30);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1cb4);
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1cb0);
        tcu::TestLog::operator<<(&local_1e38,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<(&local_1e38,(char (*) [9])0x135d65c);
        preserveAttachmentsSection.m_log._4_4_ = AttachmentReference::getImageLayout(local_1b30);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(VkImageLayout *)((long)&preserveAttachmentsSection.m_log + 4));
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1e38);
        tcu::ScopedLogSection::~ScopedLogSection(&local_1aa8);
        resolveAttachmentSection.m_log =
             (TestLog *)((long)&(resolveAttachmentSection.m_log)->m_log + 1);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_1a48);
    }
    bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       inputAttachmentsSection.m_log);
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e68,"Preserves",&local_1e69);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e90,"Preserves",(allocator<char> *)((long)&preserveNdx + 7));
      tcu::ScopedLogSection::ScopedLogSection(&local_1e48,log,&local_1e68,&local_1e90);
      std::__cxx11::string::~string((string *)&local_1e90);
      std::allocator<char>::~allocator((allocator<char> *)((long)&preserveNdx + 7));
      std::__cxx11::string::~string((string *)&local_1e68);
      std::allocator<char>::~allocator(&local_1e69);
      preserveAttachmentSection.m_log = (TestLog *)0x0;
      while( true ) {
        SVar1.m_log = preserveAttachmentSection.m_log;
        pTVar4 = (TestLog *)
                 std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            inputAttachmentsSection.m_log);
        if (pTVar4 <= SVar1.m_log) break;
        de::toString<unsigned_long>(&local_1ee8,(unsigned_long *)&preserveAttachmentSection);
        std::operator+(&local_1ec8,"Preserve",&local_1ee8);
        de::toString<unsigned_long>
                  ((string *)local_1f28,(unsigned_long *)&preserveAttachmentSection);
        std::operator+(&local_1f08,"Preserve ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f28);
        tcu::ScopedLogSection::ScopedLogSection(&local_1ea8,log,&local_1ec8,&local_1f08);
        std::__cxx11::string::~string((string *)&local_1f08);
        std::__cxx11::string::~string((string *)local_1f28);
        std::__cxx11::string::~string((string *)&local_1ec8);
        std::__cxx11::string::~string((string *)&local_1ee8);
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            inputAttachmentsSection.m_log,(size_type)preserveAttachmentSection.m_log
                           );
        local_1f2c = *pvVar6;
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&dependenciesSection,log,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&dependenciesSection,(char (*) [13])"Attachment: ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1f2c);
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&dependenciesSection);
        tcu::ScopedLogSection::~ScopedLogSection(&local_1ea8);
        preserveAttachmentSection.m_log =
             (TestLog *)((long)&(preserveAttachmentSection.m_log)->m_log + 1);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_1e48);
    }
    tcu::ScopedLogSection::~ScopedLogSection(&local_e28);
    subpassSection.m_log = (TestLog *)((long)&(subpassSection.m_log)->m_log + 1);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_dc0);
  pvVar7 = RenderPass::getDependencies((RenderPass *)section.m_log);
  bVar2 = std::
          vector<vkt::(anonymous_namespace)::SubpassDependency,_std::allocator<vkt::(anonymous_namespace)::SubpassDependency>_>
          ::empty(pvVar7);
  if (!bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_20d8,"Dependencies",&local_20d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2100,"Dependencies",(allocator<char> *)((long)&depNdx + 7));
    tcu::ScopedLogSection::ScopedLogSection(&local_20b8,log,&local_20d8,&local_2100);
    std::__cxx11::string::~string((string *)&local_2100);
    std::allocator<char>::~allocator((allocator<char> *)((long)&depNdx + 7));
    std::__cxx11::string::~string((string *)&local_20d8);
    std::allocator<char>::~allocator(&local_20d9);
    dependencySection.m_log = (TestLog *)0x0;
    while( true ) {
      SVar1.m_log = dependencySection.m_log;
      pvVar7 = RenderPass::getDependencies((RenderPass *)section.m_log);
      pTVar4 = (TestLog *)
               std::
               vector<vkt::(anonymous_namespace)::SubpassDependency,_std::allocator<vkt::(anonymous_namespace)::SubpassDependency>_>
               ::size(pvVar7);
      if (pTVar4 <= SVar1.m_log) break;
      de::toString<unsigned_long>(&local_2158,(unsigned_long *)&dependencySection);
      std::operator+(&local_2138,"Dependency",&local_2158);
      de::toString<unsigned_long>((string *)&dep,(unsigned_long *)&dependencySection);
      std::operator+(&local_2178,"Dependency ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dep);
      tcu::ScopedLogSection::ScopedLogSection(&local_2118,log,&local_2138,&local_2178);
      std::__cxx11::string::~string((string *)&local_2178);
      std::__cxx11::string::~string((string *)&dep);
      std::__cxx11::string::~string((string *)&local_2138);
      std::__cxx11::string::~string((string *)&local_2158);
      pvVar7 = RenderPass::getDependencies((RenderPass *)section.m_log);
      local_21a0 = std::
                   vector<vkt::(anonymous_namespace)::SubpassDependency,_std::allocator<vkt::(anonymous_namespace)::SubpassDependency>_>
                   ::operator[](pvVar7,(size_type)dependencySection.m_log);
      tcu::TestLog::operator<<(&local_2320,log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_2320,(char (*) [9])"Source: ");
      local_2324 = SubpassDependency::getSrcPass(local_21a0);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_2324);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_2320);
      tcu::TestLog::operator<<(&local_24a8,log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_24a8,(char (*) [14])"Destination: ");
      local_24ac = SubpassDependency::getDstPass(local_21a0);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_24ac);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_24a8);
      tcu::TestLog::operator<<(&local_2630,log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_2630,(char (*) [20])"Source Stage Mask: ");
      local_2634 = SubpassDependency::getSrcStageMask(local_21a0);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_2634);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_2630);
      tcu::TestLog::operator<<(&local_27b8,log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_27b8,(char (*) [25])"Destination Stage Mask: ");
      local_27bc = SubpassDependency::getDstStageMask(local_21a0);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_27bc);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_27b8);
      tcu::TestLog::operator<<(&local_2940,log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_2940,(char (*) [13])"Input Mask: ");
      local_2944 = SubpassDependency::getInputMask(local_21a0);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_2944);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_2940);
      tcu::TestLog::operator<<(&local_2ac8,log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_2ac8,(char (*) [14])"Output Mask: ");
      local_2acc = SubpassDependency::getOutputMask(local_21a0);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_2acc);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_2ac8);
      tcu::TestLog::operator<<(&local_2c50,log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_2c50,(char (*) [19])"Dependency Flags: ");
      value = SubpassDependency::getFlags(local_21a0);
      ::vk::getDependencyFlagsStr(&local_2c68,value);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_2c68);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_2c50);
      tcu::ScopedLogSection::~ScopedLogSection(&local_2118);
      dependencySection.m_log = (TestLog *)((long)&(dependencySection.m_log)->m_log + 1);
    }
    tcu::ScopedLogSection::~ScopedLogSection(&local_20b8);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_20);
  return;
}

Assistant:

void logRenderPassInfo (TestLog&			log,
						const RenderPass&	renderPass)
{
	const tcu::ScopedLogSection section (log, "RenderPass", "RenderPass");

	{
		const tcu::ScopedLogSection	attachmentsSection	(log, "Attachments", "Attachments");
		const vector<Attachment>&	attachments			= renderPass.getAttachments();

		for (size_t attachmentNdx = 0; attachmentNdx < attachments.size(); attachmentNdx++)
		{
			const tcu::ScopedLogSection	attachmentSection	(log, "Attachment" + de::toString(attachmentNdx), "Attachment " + de::toString(attachmentNdx));
			const Attachment&			attachment			= attachments[attachmentNdx];

			log << TestLog::Message << "Format: " << attachment.getFormat() << TestLog::EndMessage;
			log << TestLog::Message << "Samples: " << attachment.getSamples() << TestLog::EndMessage;

			log << TestLog::Message << "LoadOp: " << attachment.getLoadOp() << TestLog::EndMessage;
			log << TestLog::Message << "StoreOp: " << attachment.getStoreOp() << TestLog::EndMessage;

			log << TestLog::Message << "StencilLoadOp: " << attachment.getStencilLoadOp() << TestLog::EndMessage;
			log << TestLog::Message << "StencilStoreOp: " << attachment.getStencilStoreOp() << TestLog::EndMessage;

			log << TestLog::Message << "InitialLayout: " << attachment.getInitialLayout() << TestLog::EndMessage;
			log << TestLog::Message << "FinalLayout: " << attachment.getFinalLayout() << TestLog::EndMessage;
		}
	}

	{
		const tcu::ScopedLogSection	subpassesSection	(log, "Subpasses", "Subpasses");
		const vector<Subpass>&		subpasses			= renderPass.getSubpasses();

		for (size_t subpassNdx = 0; subpassNdx < subpasses.size(); subpassNdx++)
		{
			const tcu::ScopedLogSection			subpassSection		(log, "Subpass" + de::toString(subpassNdx), "Subpass " + de::toString(subpassNdx));
			const Subpass&						subpass				= subpasses[subpassNdx];

			const vector<AttachmentReference>&	inputAttachments	= subpass.getInputAttachments();
			const vector<AttachmentReference>&	colorAttachments	= subpass.getColorAttachments();
			const vector<AttachmentReference>&	resolveAttachments	= subpass.getResolveAttachments();
			const vector<deUint32>&				preserveAttachments	= subpass.getPreserveAttachments();

			if (!inputAttachments.empty())
			{
				const tcu::ScopedLogSection	inputAttachmentsSection	(log, "Inputs", "Inputs");

				for (size_t inputNdx = 0; inputNdx < inputAttachments.size(); inputNdx++)
				{
					const tcu::ScopedLogSection	inputAttachmentSection	(log, "Input" + de::toString(inputNdx), "Input " + de::toString(inputNdx));
					const AttachmentReference&	inputAttachment			= inputAttachments[inputNdx];

					log << TestLog::Message << "Attachment: " << inputAttachment.getAttachment() << TestLog::EndMessage;
					log << TestLog::Message << "Layout: " << inputAttachment.getImageLayout() << TestLog::EndMessage;
				}
			}

			if (subpass.getDepthStencilAttachment().getAttachment() != VK_ATTACHMENT_UNUSED)
			{
				const tcu::ScopedLogSection	depthStencilAttachmentSection	(log, "DepthStencil", "DepthStencil");
				const AttachmentReference&	depthStencilAttachment			= subpass.getDepthStencilAttachment();

				log << TestLog::Message << "Attachment: " << depthStencilAttachment.getAttachment() << TestLog::EndMessage;
				log << TestLog::Message << "Layout: " << depthStencilAttachment.getImageLayout() << TestLog::EndMessage;
			}

			if (!colorAttachments.empty())
			{
				const tcu::ScopedLogSection	colorAttachmentsSection	(log, "Colors", "Colors");

				for (size_t colorNdx = 0; colorNdx < colorAttachments.size(); colorNdx++)
				{
					const tcu::ScopedLogSection	colorAttachmentSection	(log, "Color" + de::toString(colorNdx), "Color " + de::toString(colorNdx));
					const AttachmentReference&	colorAttachment			= colorAttachments[colorNdx];

					log << TestLog::Message << "Attachment: " << colorAttachment.getAttachment() << TestLog::EndMessage;
					log << TestLog::Message << "Layout: " << colorAttachment.getImageLayout() << TestLog::EndMessage;
				}
			}

			if (!resolveAttachments.empty())
			{
				const tcu::ScopedLogSection	resolveAttachmentsSection	(log, "Resolves", "Resolves");

				for (size_t resolveNdx = 0; resolveNdx < resolveAttachments.size(); resolveNdx++)
				{
					const tcu::ScopedLogSection	resolveAttachmentSection	(log, "Resolve" + de::toString(resolveNdx), "Resolve " + de::toString(resolveNdx));
					const AttachmentReference&	resolveAttachment			= resolveAttachments[resolveNdx];

					log << TestLog::Message << "Attachment: " << resolveAttachment.getAttachment() << TestLog::EndMessage;
					log << TestLog::Message << "Layout: " << resolveAttachment.getImageLayout() << TestLog::EndMessage;
				}
			}

			if (!preserveAttachments.empty())
			{
				const tcu::ScopedLogSection	preserveAttachmentsSection	(log, "Preserves", "Preserves");

				for (size_t preserveNdx = 0; preserveNdx < preserveAttachments.size(); preserveNdx++)
				{
					const tcu::ScopedLogSection	preserveAttachmentSection	(log, "Preserve" + de::toString(preserveNdx), "Preserve " + de::toString(preserveNdx));
					const deUint32				preserveAttachment			= preserveAttachments[preserveNdx];

					log << TestLog::Message << "Attachment: " << preserveAttachment << TestLog::EndMessage;
				}
			}
		}

	}

	if (!renderPass.getDependencies().empty())
	{
		const tcu::ScopedLogSection	dependenciesSection	(log, "Dependencies", "Dependencies");

		for (size_t depNdx = 0; depNdx < renderPass.getDependencies().size(); depNdx++)
		{
			const tcu::ScopedLogSection	dependencySection	(log, "Dependency" + de::toString(depNdx), "Dependency " + de::toString(depNdx));
			const SubpassDependency&	dep					= renderPass.getDependencies()[depNdx];

			log << TestLog::Message << "Source: " << dep.getSrcPass() << TestLog::EndMessage;
			log << TestLog::Message << "Destination: " << dep.getDstPass() << TestLog::EndMessage;

			log << TestLog::Message << "Source Stage Mask: " << dep.getSrcStageMask() << TestLog::EndMessage;
			log << TestLog::Message << "Destination Stage Mask: " << dep.getDstStageMask() << TestLog::EndMessage;

			log << TestLog::Message << "Input Mask: " << dep.getInputMask() << TestLog::EndMessage;
			log << TestLog::Message << "Output Mask: " << dep.getOutputMask() << TestLog::EndMessage;
			log << TestLog::Message << "Dependency Flags: " << getDependencyFlagsStr(dep.getFlags()) << TestLog::EndMessage;
		}
	}
}